

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::DescriptorScalarReplacement::GetNumBindingsUsedByType
          (DescriptorScalarReplacement *this,uint32_t type_id)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  DefUseManager *pDVar5;
  IRContext *pIVar6;
  ConstantManager *this_00;
  Constant *this_01;
  uint local_44;
  uint32_t local_40;
  uint32_t i;
  uint32_t sum;
  uint32_t num_elems;
  Constant *length_const;
  uint32_t length_id;
  uint32_t element_type_id;
  Instruction *type_inst;
  uint32_t type_id_local;
  DescriptorScalarReplacement *this_local;
  
  pDVar5 = Pass::get_def_use_mgr(&this->super_Pass);
  _length_id = analysis::DefUseManager::GetDef(pDVar5,type_id);
  OVar2 = opt::Instruction::opcode(_length_id);
  if (OVar2 == OpTypePointer) {
    uVar3 = opt::Instruction::GetSingleWordInOperand(_length_id,1);
    pDVar5 = Pass::get_def_use_mgr(&this->super_Pass);
    _length_id = analysis::DefUseManager::GetDef(pDVar5,uVar3);
  }
  OVar2 = opt::Instruction::opcode(_length_id);
  if (OVar2 == OpTypeArray) {
    uVar3 = opt::Instruction::GetSingleWordInOperand(_length_id,0);
    uVar4 = opt::Instruction::GetSingleWordInOperand(_length_id,1);
    pIVar6 = Pass::context(&this->super_Pass);
    this_00 = IRContext::get_constant_mgr(pIVar6);
    this_01 = analysis::ConstantManager::FindDeclaredConstant(this_00,uVar4);
    if (this_01 == (Constant *)0x0) {
      __assert_fail("length_const != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/desc_sroa.cpp"
                    ,0x17c,
                    "uint32_t spvtools::opt::DescriptorScalarReplacement::GetNumBindingsUsedByType(uint32_t)"
                   );
    }
    uVar4 = analysis::Constant::GetU32(this_01);
    uVar3 = GetNumBindingsUsedByType(this,uVar3);
    this_local._4_4_ = uVar4 * uVar3;
  }
  else {
    OVar2 = opt::Instruction::opcode(_length_id);
    if (OVar2 == OpTypeStruct) {
      pIVar6 = Pass::context(&this->super_Pass);
      bVar1 = descsroautil::IsTypeOfStructuredBuffer(pIVar6,_length_id);
      if (!bVar1) {
        local_40 = 0;
        for (local_44 = 0; uVar3 = opt::Instruction::NumInOperands(_length_id), local_44 < uVar3;
            local_44 = local_44 + 1) {
          uVar3 = opt::Instruction::GetSingleWordInOperand(_length_id,local_44);
          uVar3 = GetNumBindingsUsedByType(this,uVar3);
          local_40 = uVar3 + local_40;
        }
        return local_40;
      }
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t DescriptorScalarReplacement::GetNumBindingsUsedByType(
    uint32_t type_id) {
  Instruction* type_inst = get_def_use_mgr()->GetDef(type_id);

  // If it's a pointer, look at the underlying type.
  if (type_inst->opcode() == spv::Op::OpTypePointer) {
    type_id = type_inst->GetSingleWordInOperand(1);
    type_inst = get_def_use_mgr()->GetDef(type_id);
  }

  // Arrays consume N*M binding numbers where N is the array length, and M is
  // the number of bindings used by each array element.
  if (type_inst->opcode() == spv::Op::OpTypeArray) {
    uint32_t element_type_id = type_inst->GetSingleWordInOperand(0);
    uint32_t length_id = type_inst->GetSingleWordInOperand(1);
    const analysis::Constant* length_const =
        context()->get_constant_mgr()->FindDeclaredConstant(length_id);
    // OpTypeArray's length must always be a constant
    assert(length_const != nullptr);
    uint32_t num_elems = length_const->GetU32();
    return num_elems * GetNumBindingsUsedByType(element_type_id);
  }

  // The number of bindings consumed by a structure is the sum of the bindings
  // used by its members.
  if (type_inst->opcode() == spv::Op::OpTypeStruct &&
      !descsroautil::IsTypeOfStructuredBuffer(context(), type_inst)) {
    uint32_t sum = 0;
    for (uint32_t i = 0; i < type_inst->NumInOperands(); i++)
      sum += GetNumBindingsUsedByType(type_inst->GetSingleWordInOperand(i));
    return sum;
  }

  // All other types are considered to take up 1 binding number.
  return 1;
}